

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>::CreateBCGeoEl
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *this,int side,int bc)

{
  TPZGeoMesh *pTVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  int iVar5;
  MElementType MVar6;
  uint uVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  TPZGeoEl *gel;
  long lVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  TPZManVector<long,_4> nodeindices;
  TPZStack<int,_10> LowAllSides;
  int64_t index;
  TPZManVector<int,_27> mapside;
  TPZGeoElSide BCGelside;
  TPZGeoElSide thisside;
  int local_18c;
  TPZManVector<long,_4> local_188;
  TPZManVector<int,_10> local_148;
  undefined1 local_f8 [8];
  TPZManVector<int,_27> local_f0;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  long lVar16;
  
  if ((uint)side < 0x15) {
    if (side != 0x14) {
      iVar5 = pztopology::TPZPrism::NumSides(1);
      local_18c = (side - iVar5) + -6;
      iVar5 = pztopology::TPZPrism::GetSideOrient(&local_18c);
      MVar6 = pztopology::TPZPrism::Type(side);
      uVar7 = pztopology::TPZPrism::NSideNodes(side);
      if (EQuadrilateral < MVar6) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoelrefless.h.h"
                   ,0x124);
      }
      lVar11 = *(long *)(&DAT_0151f750 + (ulong)MVar6 * 8);
      local_148.super_TPZVec<int>._vptr_TPZVec =
           (_func_int **)((ulong)local_148.super_TPZVec<int>._vptr_TPZVec._4_4_ << 0x20);
      TPZManVector<int,_27>::TPZManVector(&local_f0,lVar11,(int *)&local_148);
      auVar2 = _DAT_014d28c0;
      lVar9 = lVar11 + -1;
      auVar14._8_4_ = (int)lVar9;
      auVar14._0_8_ = lVar9;
      auVar14._12_4_ = (int)((ulong)lVar9 >> 0x20);
      lVar9 = 0;
      auVar14 = auVar14 ^ _DAT_014d28c0;
      auVar15 = _DAT_014d28b0;
      do {
        auVar17 = auVar15 ^ auVar2;
        if ((bool)(~(auVar17._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar17._0_4_ ||
                    auVar14._4_4_ < auVar17._4_4_) & 1)) {
          local_f0.super_TPZVec<int>.fStore[lVar9] = (int)lVar9;
        }
        if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
            auVar17._12_4_ <= auVar14._12_4_) {
          local_f0.super_TPZVec<int>.fStore[lVar9 + 1] = (int)lVar9 + 1;
        }
        lVar9 = lVar9 + 2;
        lVar16 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 2;
        auVar15._8_8_ = lVar16 + 2;
      } while (lVar11 + 1 != lVar9);
      if (iVar5 == -1) {
        if (MVar6 == EQuadrilateral) {
          local_188.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&local_148;
          local_148.super_TPZVec<int>.fNElements._0_4_ = 7;
          local_148.super_TPZVec<int>.fNElements._4_4_ = 6;
          local_148.super_TPZVec<int>.fNAlloc._0_4_ = 5;
          local_148.super_TPZVec<int>.fNAlloc._4_4_ = 4;
          local_148.super_TPZVec<int>._vptr_TPZVec = (_func_int **)0x300000000;
          local_148.super_TPZVec<int>.fStore._0_4_ = 2;
          local_148.super_TPZVec<int>.fStore._4_4_ = 1;
          local_148.fExtAlloc[0] = 8;
          local_188.super_TPZVec<long>.fStore = (long *)0x9;
          TPZManVector<int,_27>::operator=(&local_f0,(initializer_list<int> *)&local_188);
        }
        else if (MVar6 == ETriangle) {
          local_188.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&local_148;
          local_148.super_TPZVec<int>.fNElements._0_4_ = 4;
          local_148.super_TPZVec<int>.fNElements._4_4_ = 3;
          local_148.super_TPZVec<int>.fNAlloc._0_4_ = 6;
          local_148.super_TPZVec<int>._vptr_TPZVec = (_func_int **)0x200000000;
          local_148.super_TPZVec<int>.fStore._0_4_ = 1;
          local_148.super_TPZVec<int>.fStore._4_4_ = 5;
          local_188.super_TPZVec<long>.fStore = (long *)0x7;
          TPZManVector<int,_27>::operator=(&local_f0,(initializer_list<int> *)&local_188);
        }
        else if (MVar6 == EOned) {
          local_148.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&local_188;
          local_188.super_TPZVec<long>._vptr_TPZVec = (_func_int **)0x1;
          local_188.super_TPZVec<long>.fStore =
               (long *)CONCAT44(local_188.super_TPZVec<long>.fStore._4_4_,2);
          local_148.super_TPZVec<int>.fStore._0_4_ = 3;
          local_148.super_TPZVec<int>.fStore._4_4_ = 0;
          TPZManVector<int,_27>::operator=(&local_f0,(initializer_list<int> *)&local_148);
        }
      }
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_148);
      pztopology::TPZPrism::LowerDimensionSides(side,(TPZStack<int,_10> *)&local_148);
      TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_148,side);
      bVar3 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::IsLinearMapping(&this->fGeo,side);
      lVar9 = CONCAT44(local_148.super_TPZVec<int>.fNElements._4_4_,
                       (undefined4)local_148.super_TPZVec<int>.fNElements);
      if (0 < lVar9) {
        lVar11 = 0;
        do {
          iVar10 = *(int *)(CONCAT44(local_148.super_TPZVec<int>.fStore._4_4_,
                                     local_148.super_TPZVec<int>.fStore._0_4_) + lVar11 * 4);
          if (5 < iVar10) {
            bVar4 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::IsLinearMapping(&this->fGeo,iVar10);
            if (!bVar4 || !bVar3) goto LAB_00eca50e;
            lVar9 = CONCAT44(local_148.super_TPZVec<int>.fNElements._4_4_,
                             (undefined4)local_148.super_TPZVec<int>.fNElements);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < lVar9);
      }
      if (bVar3) {
        TPZManVector<long,_4>::TPZManVector(&local_188,(long)(int)uVar7);
        if (0 < (int)uVar7) {
          uVar13 = 0;
          do {
            if (iVar5 == -1) {
              iVar10 = local_f0.super_TPZVec<int>.fStore[uVar13];
            }
            else {
              iVar10 = (int)uVar13;
            }
            lVar9 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x128))
                              (this,side,uVar13 & 0xffffffff);
            local_188.super_TPZVec<long>.fStore[iVar10] = lVar9;
            uVar13 = uVar13 + 1;
          } while (uVar7 != uVar13);
        }
        MVar6 = pztopology::TPZPrism::Type(side);
        pTVar1 = (this->super_TPZGeoEl).fMesh;
        iVar5 = (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xc])
                          (pTVar1,(ulong)MVar6,&local_188,(ulong)(uint)bc,local_f8,1);
        gel = (TPZGeoEl *)CONCAT44(extraout_var,iVar5);
        TPZGeoElSide::TPZGeoElSide(&local_60,gel);
        local_48.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
        local_48.fGeoEl = &this->super_TPZGeoEl;
        local_48.fSide = side;
        TPZGeoElSide::InsertConnectivity(&local_60,&local_48,&local_f0.super_TPZVec<int>);
        (**(code **)(*(long *)gel + 0x78))(gel);
        if (local_188.super_TPZVec<long>.fStore != local_188.fExtAlloc) {
          local_188.super_TPZVec<long>.fNAlloc = 0;
          local_188.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
          if (local_188.super_TPZVec<long>.fStore != (long *)0x0) {
            operator_delete__(local_188.super_TPZVec<long>.fStore);
          }
        }
      }
      else {
LAB_00eca50e:
        gel = (TPZGeoEl *)
              (**(code **)(*(long *)&this->super_TPZGeoEl + 0x2e0))(this,side,bc,&local_f0);
      }
      TPZManVector<int,_10>::~TPZManVector(&local_148);
      if (local_f0.super_TPZVec<int>.fStore == local_f0.fExtAlloc) {
        return gel;
      }
      local_f0.super_TPZVec<int>.fNAlloc = 0;
      local_f0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_f0.super_TPZVec<int>.fStore == (int *)0x0) {
        return gel;
      }
      operator_delete__(local_f0.super_TPZVec<int>.fStore);
      return gel;
    }
    poVar8 = (ostream *)&std::cout;
    pcVar12 = "\nCreateBCGeoEl not implemented for tridimensional sides \n";
    lVar9 = 0x39;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n (",3);
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,")::CreateBCGeoEl unexpected side = ",0x23);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,side);
    pcVar12 = "\n";
    lVar9 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar12,lVar9);
  return (TPZGeoEl *)0x0;
}

Assistant:

TPZGeoEl *
TPZGeoElRefLess<TGeo>::CreateBCGeoEl(int side, int bc){
	// Consistency check
	int nsides = TGeo::NSides;
	if(side<0 || side >= nsides){
		std::cout << "\n ("<<TGeo::Type()<<")::CreateBCGeoEl unexpected side = " << side << "\n";
		return 0;
	}
	if(fGeo.Dimension == 3 && side == nsides-1){
		std::cout <<"\nCreateBCGeoEl not implemented for tridimensional sides \n";
		return 0;
	}
    
    // the side orientation will be +1 if the side is oriented counterclockwise
    // -1 if the side is clockwise
    
    
    int faceSide = 0;
    if (fGeo.Dimension == 2){
        faceSide = side - TGeo::NCornerNodes;
    } else if (fGeo.Dimension == 3){
        faceSide = side - TGeo::NCornerNodes - TGeo::NumSides(1);
    }

    int sideorient = 1;
    switch (TGeo::Type())
    {
    case ETriangle:
        sideorient = pztopology::TPZTriangle::GetSideOrient(faceSide);
        break;
    case EQuadrilateral:
        sideorient = pztopology::TPZQuadrilateral::GetSideOrient(faceSide);
        break;
    case ETetraedro:
        sideorient = pztopology::TPZTetrahedron::GetSideOrient(faceSide);
        break;
    case ECube:
        sideorient = pztopology::TPZCube::GetSideOrient(faceSide);
        break;
    case EPrisma:
        sideorient = pztopology::TPZPrism::GetSideOrient(faceSide);
        break;
    
    default:
        break;
    }
    
    
    // Build vector with node indices of element to be created
    MElementType sidetype = TGeo::Type(side);
    int sidennodes = TGeo::NSideNodes(side);
    int sizeMap = 0;
    switch (sidetype){
    case EPoint:
        sizeMap = 1;
        break;
    case EOned:
        sizeMap = 3;
        break;
    case ETriangle:
        sizeMap = 7;
        break;
    case EQuadrilateral:
        sizeMap = 9;
        break;
    default:
        DebugStop();
    }

    TPZManVector<int,27> mapside(sizeMap,0);
    for(int i=0; i<sizeMap; i++) mapside[i] = i;
    
    if(sideorient == -1)
    {
        switch(sidetype){
            case EOned:
                mapside = {1,0,2};
                break;
            case ETriangle:
                mapside = {0,2,1,5,4,3,6};
                break;
            case EQuadrilateral:
                mapside = {0,3,2,1,7,6,5,4,8};
            default:
                break;
        }
    }

	// Is side straight?
	TPZStack<int> LowAllSides;
	TGeo::LowerDimensionSides(side,LowAllSides);
    LowAllSides.Push(side);
	bool straight = true;
    if(fGeo.IsLinearMapping(side) == false) straight = false;
	for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
	{
		int lside = LowAllSides[lowside]; 
		if(lside < TGeo::NNodes) continue;
		if(fGeo.IsLinearMapping(lside) == false) straight = false;
		if(straight == false) break;
	}
	if(straight == false)
	{
		TPZGeoEl *BCGeoEl = CreateBCGeoBlendEl(side,bc,mapside);
		return BCGeoEl;
	}
	
	// else

	TPZManVector<int64_t,4> nodeindices(sidennodes);
	for(int inode = 0; inode < sidennodes; inode++){
        int orientednode = inode;
        if(sideorient == -1) orientednode = mapside[inode];
		nodeindices[orientednode] = this->SideNodeIndex(side,inode);
	}

	// Create GeoElement
	int64_t index;
	MElementType BCtype = TGeo::Type(side);
	TPZGeoEl *BCGeoEl = this->Mesh()->CreateGeoElement(BCtype, nodeindices, bc, index);

    TPZGeoElSide BCGelside(BCGeoEl);
    TPZGeoElSide thisside(this,side);
    BCGelside.InsertConnectivity(thisside,mapside);
    /*
	// Set Connectivity
	int sidensides = TGeo::NContainedSides(side);
	for(int iside=0; iside < sidensides-1; iside++){
		TPZGeoElSide(BCGeoEl,mapside[iside]).SetConnectivity(TPZGeoElSide(this,TGeo::ContainedSideLocId(side,iside)));
	}
	TPZGeoElSide(BCGeoEl, sidensides-1).SetConnectivity(TPZGeoElSide(this,side));
*/
	// Return pointer to new element
	BCGeoEl->Initialize();
	return BCGeoEl;  
}